

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_217::SignaturePruning::run(SignaturePruning *this,Module *module)

{
  bool *this_00;
  Name *funcs;
  size_t *this_01;
  pointer puVar1;
  _Storage<wasm::HeapType,_true> *p_Var2;
  pointer puVar3;
  Function *pFVar4;
  long lVar5;
  long *plVar6;
  _Storage<wasm::HeapType,_true> _Var7;
  Type TVar8;
  Type TVar9;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *module_00;
  bool bVar10;
  uint uVar11;
  mapped_type_conflict *__args_1;
  Function *pFVar12;
  mapped_type *pmVar13;
  Call *pCVar14;
  Expression **ppEVar15;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *this_02;
  Function *pFVar16;
  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_03;
  size_t sVar17;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar18;
  size_type sVar19;
  Type *__x;
  mapped_type *pmVar20;
  long *plVar21;
  size_t i;
  _Storage<wasm::HeapType,_true> *p_Var22;
  Module *wasm;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar23;
  pointer puVar24;
  pointer *ppuVar25;
  _Storage<wasm::HeapType,_true> _Var26;
  optional<wasm::HeapType> oVar27;
  undefined1 local_458 [8];
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  undefined1 local_2d0 [8];
  SubTypes subTypes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1b8;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_1a0;
  Module *local_188;
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  Type local_f0;
  Type oldParams;
  undefined1 auStack_d8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  undefined1 local_b8 [8];
  Signature sig;
  undefined1 local_98 [8];
  SortedVector removedIndexes;
  undefined4 uStack_78;
  undefined4 uStack_74;
  Type calledType;
  _Storage<wasm::HeapType,_true> local_60;
  Call *call;
  Function *local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *f;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  if (((module->features).features & 0x400) != 0) {
    if ((((this->super_Pass).runner)->options).closedWorld == false) {
      Fatal::Fatal((Fatal *)local_458);
      Fatal::operator<<((Fatal *)local_458,(char (*) [41])"SignaturePruning requires --closed-world"
                       );
      Fatal::~Fatal((Fatal *)local_458);
    }
    if ((module->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (module->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      allInfo._M_h._M_single_bucket = (__node_base_ptr)0x0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&analysis.map
      ;
      analysis.map._M_t._M_impl._0_4_ = 0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar1 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_188 = module;
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           analysis.map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (puVar23 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar1;
          puVar23 = puVar23 + 1) {
        local_458 = (undefined1  [8])
                    (puVar23->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        std::
        map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
        ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                      *)&analysis,(key_type *)local_458);
      }
      puVar1 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sig.results.id = (uintptr_t)this;
      f = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)module;
      for (puVar23 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; module_00 = f, puVar23 != puVar1;
          puVar23 = puVar23 + 1) {
        pFVar12 = (puVar23->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(pFVar12->super_Importable).module + 8) != (char *)0x0) {
          local_458 = (undefined1  [8])pFVar12;
          __args_1 = std::
                     map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                     ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                   *)&analysis,(key_type *)local_458);
          std::function<void_(wasm::Function_*,_Info_&)>::operator()
                    ((function<void_(wasm::Function_*,_Info_&)> *)&allInfo._M_h._M_single_bucket,
                     pFVar12,__args_1);
        }
      }
      PassRunner::PassRunner((PassRunner *)local_2d0,(Module *)f);
      std::function<void_(wasm::Function_*,_Info_&)>::function
                ((function<void_(wasm::Function_*,_Info_&)> *)
                 &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (function<void_(wasm::Function_*,_Info_&)>_conflict *)
                 &allInfo._M_h._M_single_bucket);
      wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
      run(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
      ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,wasm::
      (anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info&)>)::Mapper::Mapper(wasm::
      Module&,std::map<wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::
      Module*)::Info,std::less<wasm::Function*>,std::allocator<std::pair<wasm::Function*const,wasm::
      (anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info>>>&,std::function<void(wasm
      ::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info__>_
                (local_458,(Module *)module_00,(Map *)&analysis,
                 (Func *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Pass::setPassRunner((Pass *)local_458,(PassRunner *)local_2d0);
      (**(code **)&(((Importable *)local_458)->super_Named).hasExplicitName)
                ((Pass *)local_458,module_00);
      ::anon_func::Mapper::~Mapper((Mapper *)local_458);
      this_01 = &analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::_Function_base::~_Function_base((_Function_base *)this_01);
      PassRunner::~PassRunner((PassRunner *)local_2d0);
      std::_Function_base::~_Function_base((_Function_base *)&allInfo._M_h._M_single_bucket);
      analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&allInfo._M_h._M_rehash_policy._M_next_resize;
      allInfo._M_h._M_buckets = (__buckets_ptr)0x1;
      allInfo._M_h._M_bucket_count = 0;
      allInfo._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      allInfo._M_h._M_element_count._0_4_ = 0x3f800000;
      allInfo._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      allInfo._M_h._M_rehash_policy._4_4_ = 0;
      allInfo._M_h._M_rehash_policy._M_next_resize = 0;
      local_458 = (undefined1  [8])&sigFuncs.Map._M_h._M_rehash_policy._M_next_resize;
      sigFuncs.Map._M_h._M_buckets = (__buckets_ptr)0x1;
      sigFuncs.Map._M_h._M_bucket_count = 0;
      sigFuncs.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      sigFuncs.Map._M_h._M_element_count._0_4_ = 0x3f800000;
      sigFuncs.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      sigFuncs.Map._M_h._M_rehash_policy._4_4_ = 0;
      sigFuncs.Map._M_h._M_rehash_policy._M_next_resize = 0;
      sigFuncs.Map._M_h._M_single_bucket = (__node_base_ptr)&sigFuncs.Map._M_h._M_single_bucket;
      sigFuncs.List.
      super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)module_00[4]._M_t.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pFVar12 = module_00[3]._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      sigFuncs.List.
      super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)sigFuncs.Map._M_h._M_single_bucket;
      while (wasm = (Module *)f,
            pFVar12 !=
            (Function *)
            removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
        local_2d0 = *(undefined1 (*) [8])&(pFVar12->super_Importable).super_Named.name;
        local_48 = pFVar12;
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)std::
                      map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                      ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                    *)&analysis,(key_type *)local_2d0);
        p_Var2 = (_Storage<wasm::HeapType,_true> *)
                 (((mapped_type_conflict *)__range2)->calls).
                 super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (p_Var22 = (_Storage<wasm::HeapType,_true> *)
                       (((mapped_type_conflict *)__range2)->calls).
                       super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                       super__Vector_impl_data._M_start; p_Var22 != p_Var2; p_Var22 = p_Var22 + 1) {
          local_60 = *p_Var22;
          pFVar12 = Module::getFunction((Module *)f,
                                        (Name)(((Name *)((long)local_60 + 0x30))->super_IString).str
                                       );
          pmVar13 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)this_01,&pFVar12->type);
          std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::push_back
                    (&pmVar13->calls,(value_type *)&local_60);
          _uStack_78 = (uintptr_t)f;
          pCVar14 = Intrinsics::isCallWithoutEffects
                              ((Intrinsics *)&stack0xffffffffffffff88,(Expression *)local_60);
          if (pCVar14 != (Call *)0x0) {
            ppEVar15 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                 ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   *)((long)local_60 + 0x10));
            if (((*ppEVar15)->type).id != 1) {
              _uStack_78 = wasm::Type::getHeapType(&(*ppEVar15)->type);
              pmVar13 = std::
                        unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                      *)this_01,(key_type *)&stack0xffffffffffffff88);
              pmVar13->optimizable = false;
            }
          }
        }
        puVar3 = __range2[1].
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar24 = __range2[1].
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar24 != puVar3;
            puVar24 = puVar24 + 1) {
          local_60 = (_Storage<wasm::HeapType,_true>)
                     (puVar24->_M_t).
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          _uStack_78 = *(uintptr_t *)
                        ((((Name *)((long)local_60 + 0x30))->super_IString).str._M_len + 8);
          if ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)_uStack_78 !=
              (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)0x1) {
            local_98 = (undefined1  [8])wasm::Type::getHeapType((Type *)&stack0xffffffffffffff88);
            pmVar13 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)this_01,(key_type *)local_98);
            std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::push_back
                      (&pmVar13->callRefs,(value_type *)&local_60);
          }
        }
        pmVar13 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)this_01,(HeapType *)((long)local_2d0 + 0x38));
        ppuVar25 = &__range2[2].
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        while (ppuVar25 = (pointer *)*ppuVar25, ppuVar25 != (pointer *)0x0) {
          local_60._M_value.id._0_4_ =
               *(undefined4 *)
                &(((pointer)(ppuVar25 + 1))->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&pmVar13->usedParams,(value_type *)&local_60);
        }
        if (*(char *)&__range2[4].
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish == '\0') {
          pmVar13 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)this_01,(HeapType *)((long)local_2d0 + 0x38));
          pmVar13->optimizable = false;
        }
        this_02 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                  ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                *)local_458,(HeapType *)((long)local_2d0 + 0x38));
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                  (this_02,(value_type *)local_2d0);
        pFVar12 = (Function *)
                  &(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
      }
      pFVar4 = f[1]._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      for (pFVar12 = (f->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl; pFVar12 != pFVar4;
          pFVar12 = (Function *)((long)&(pFVar12->super_Importable).super_Named.name + 8)) {
        lVar5 = *(long *)&(pFVar12->super_Importable).super_Named.name;
        if (*(int *)(lVar5 + 0x20) == 0) {
          pFVar16 = Module::getFunction(wasm,(Name)((IString *)(lVar5 + 0x10))->str);
          pmVar13 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &pFVar16->type);
          pmVar13->optimizable = false;
        }
      }
      SubTypes::SubTypes((SubTypes *)local_2d0,wasm);
      this_03 = (_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)(sig.results.id + 0x30);
      for (pFVar12 = (Function *)sigFuncs.Map._M_h._M_single_bucket;
          pFVar12 != (Function *)&sigFuncs.Map._M_h._M_single_bucket;
          pFVar12 = (Function *)
                    (pFVar12->super_Importable).super_Named.name.super_IString.str._M_len) {
        this_00 = &(pFVar12->super_Importable).super_Named.hasExplicitName;
        _local_b8 = HeapType::getSignature((HeapType *)this_00);
        __range2 = (vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    *)this_00;
        pmVar13 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type *)this_00);
        sVar17 = wasm::Type::size((Type *)local_b8);
        if (pmVar13->optimizable != false) {
          pvVar18 = SubTypes::getStrictSubTypes
                              ((SubTypes *)local_2d0,
                               (HeapType)
                               (__range2->
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
          if ((pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
              .super__Vector_impl_data._M_start ==
              (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
              .super__Vector_impl_data._M_finish) {
            oVar27 = HeapType::getSuperType((HeapType *)__range2);
            local_60 = oVar27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
            call._0_1_ = oVar27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_engaged;
            if (((undefined1  [16])
                 oVar27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) {
              bVar10 = HeapType::isSignature(&local_60._M_value);
              if (bVar10) goto LAB_00932451;
            }
            funcs = &(pFVar12->super_Importable).module;
            removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)&pmVar13->callRefs;
            local_48 = pFVar12;
            ParamUtils::applyConstantValues
                      ((SortedVector *)&local_60._M_value,
                       (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)funcs,
                       &pmVar13->calls,
                       (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                       removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,wasm);
            _Var7._M_value.id._1_7_ = call._1_7_;
            _Var7._M_value.id._0_1_ = call._0_1_;
            for (_Var26 = local_60; wasm = (Module *)f, _Var26 != _Var7;
                _Var26 = (_Storage<wasm::HeapType,_true>)((long)_Var26 + 4)) {
              uStack_78 = *(undefined4 *)_Var26;
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase(&(pmVar13->usedParams)._M_h,&stack0xffffffffffffff88);
            }
            if ((pmVar13->usedParams)._M_h._M_element_count != sVar17) {
              _uStack_78 = 0;
              calledType.id = 0;
              uVar11 = 0;
              while (local_98._0_4_ = uVar11, uVar11 < sVar17) {
                sVar19 = std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(&(pmVar13->usedParams)._M_h,(key_type *)local_98);
                if (sVar19 == 0) {
                  SortedVector::insert((SortedVector *)&stack0xffffffffffffff88,local_98._0_4_);
                }
                uVar11 = local_98._0_4_ + 1;
              }
              local_f0.id = (uintptr_t)local_b8;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &stack0xffffffffffffff88);
              ParamUtils::removeParameters
                        ((SortedVector *)local_98,
                         (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)funcs,
                         (SortedVector *)&local_1b8,&pmVar13->calls,
                         (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                         removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,wasm,
                         *(PassRunner **)(sig.results.id + 8));
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&local_1b8);
              pFVar12 = local_48;
              if (local_98 !=
                  (undefined1  [8])
                  removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                auStack_d8 = (undefined1  [8])0x0;
                newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                for (i = 0; (uint)i < (uint)sVar17; i = i + 1) {
                  bVar10 = SortedVector::has((SortedVector *)local_98,(uint)i);
                  if (!bVar10) {
                    __x = wasm::Type::operator[](&local_f0,i);
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8,__x);
                  }
                }
                Tuple::Tuple((Tuple *)&local_1a0,(TypeList *)auStack_d8);
                wasm::Type::Type(&oldParams,(Tuple *)&local_1a0);
                TVar8 = oldParams;
                TVar9.id = sig.params.id;
                pmVar20 = std::__detail::
                          _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::Signature>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](this_03,(key_type *)__range2);
                (pmVar20->params).id = TVar8.id;
                (pmVar20->results).id = TVar9.id;
                std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                          (&local_1a0);
                plVar6 = (long *)(pFVar12->super_Importable).module.super_IString.str._M_str;
                for (plVar21 = (long *)(pFVar12->super_Importable).module.super_IString.str._M_len;
                    plVar21 != plVar6; plVar21 = plVar21 + 1) {
                  *(pointer *)(*plVar21 + 0x38) =
                       (__range2->
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
                }
                std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                          ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8);
              }
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &stack0xffffffffffffff88);
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &local_60._M_value);
            pFVar12 = local_48;
          }
        }
LAB_00932451:
      }
      GlobalTypeRewriter::updateSignatures((SignatureUpdates *)this_03,wasm);
      SubTypes::~SubTypes((SubTypes *)local_2d0);
      InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                           *)local_458);
      std::
      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        *)&analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
      ::~map((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
              *)&analysis);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "SignaturePruning requires --closed-world";
    }

    if (!module->tables.empty()) {
      // When there are tables we must also take their types into account, which
      // would require us to take call_indirect, element segments, etc. into
      // account. For now, do nothing if there are tables.
      // TODO
      return;
    }

    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Exported functions cannot be modified.
    for (auto& exp : module->exports) {
      if (exp->kind == ExternalKind::Function) {
        auto* func = module->getFunction(exp->value);
        allInfo[func->type].optimizable = false;
      }
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getStrictSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto removedIndexes = ParamUtils::removeParameters(funcs,
                                                         unusedParams,
                                                         info.calls,
                                                         info.callRefs,
                                                         module,
                                                         getPassRunner());
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);
  }